

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_wav__metadata_alloc
                    (ma_dr_wav__metadata_parser *pParser,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  code *pcVar1;
  size_t sVar2;
  ma_uint8 *pmVar3;
  ma_dr_wav_metadata *pmVar4;
  undefined8 *in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  
  if ((in_RDI->extraCapacity != 0) || (in_RDI->metadataCount != 0)) {
    (*(code *)in_RSI[3])(in_RDI->pData,*in_RSI);
    pcVar1 = (code *)in_RSI[1];
    sVar2 = ma_dr_wav__metadata_memory_capacity(in_RDI);
    pmVar3 = (ma_uint8 *)(*pcVar1)(sVar2,*in_RSI);
    in_RDI->pData = pmVar3;
    in_RDI->pDataCursor = in_RDI->pData;
    if (in_RDI->pData == (ma_uint8 *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    pmVar4 = (ma_dr_wav_metadata *)
             ma_dr_wav__metadata_get_memory(in_RDI,(ulong)in_RDI->metadataCount * 0x70,1);
    in_RDI->pMetadata = pmVar4;
    in_RDI->metadataCursor = 0;
  }
  return MA_SUCCESS;
}

Assistant:

MA_PRIVATE ma_result ma_dr_wav__metadata_alloc(ma_dr_wav__metadata_parser* pParser, ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pParser->extraCapacity != 0 || pParser->metadataCount != 0) {
        pAllocationCallbacks->onFree(pParser->pData, pAllocationCallbacks->pUserData);
        pParser->pData = (ma_uint8*)pAllocationCallbacks->onMalloc(ma_dr_wav__metadata_memory_capacity(pParser), pAllocationCallbacks->pUserData);
        pParser->pDataCursor = pParser->pData;
        if (pParser->pData == NULL) {
            return MA_OUT_OF_MEMORY;
        }
        pParser->pMetadata = (ma_dr_wav_metadata*)ma_dr_wav__metadata_get_memory(pParser, sizeof(ma_dr_wav_metadata) * pParser->metadataCount, 1);
        pParser->metadataCursor = 0;
    }
    return MA_SUCCESS;
}